

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextWindow(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID id;
  char *str;
  
  str = "window_context";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,str,(char *)0x0);
  if ((popup_flags & 0x1fU) < 5) {
    if ((GImGui->IO).MouseReleased[popup_flags & 0x1fU] == true) {
      bVar1 = IsWindowHovered(8);
      if ((bVar1) &&
         (((popup_flags & 0x40U) == 0 ||
          ((GImGui->HoveredId == 0 && (GImGui->HoveredIdPreviousFrame == 0)))))) {
        OpenPopupEx(id,popup_flags);
      }
    }
    bVar1 = BeginPopupEx(id,0x141);
    return bVar1;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1278,"bool ImGui::IsMouseReleased(ImGuiMouseButton)");
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (!(popup_flags & ImGuiPopupFlags_NoOpenOverItems) || !IsAnyItemHovered())
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}